

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  ulong *puVar1;
  int iVar2;
  i8 iVar3;
  LogEst LVar4;
  uint uVar5;
  int iVar6;
  short in_SI;
  Bitmask *in_RDI;
  int nOrder;
  Bitmask revMask_1;
  int rc_1;
  Bitmask m;
  u32 wsFlags;
  int rc;
  Bitmask notUsed;
  WhereLevel *pLevel;
  Bitmask revMask;
  Bitmask maskNew;
  i8 isOrdered;
  LogEst rUnsorted;
  LogEst rCost;
  LogEst nOut;
  int nSpace;
  char *pSpace;
  LogEst *aSortCost;
  WhereLoop **pX;
  WhereLoop *pWLoop;
  WherePath *pTo;
  WherePath *pFrom;
  WherePath *aTo;
  WherePath *aFrom;
  int nFrom;
  int nTo;
  LogEst mxUnsorted;
  LogEst mxCost;
  int nOrderBy;
  int mxI;
  int jj;
  int ii;
  int iLoop;
  sqlite3 *db;
  Parse *pParse;
  int nLoop;
  int mxChoice;
  ulong *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar7;
  int iVar8;
  undefined4 in_stack_ffffffffffffff1c;
  ulong local_e0;
  int local_d4;
  ulong local_d0;
  uint local_c8;
  int local_c4;
  ulong local_c0;
  Bitmask *local_b8;
  ulong local_b0;
  ulong local_a8;
  byte local_9b;
  LogEst local_9a;
  short local_98;
  short local_96;
  int local_94;
  ulong *local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  ulong *local_68;
  ulong *local_60;
  ulong *local_58;
  int local_50;
  int local_4c;
  short sVar9;
  short sVar10;
  int iVar11;
  int local_40;
  int in_stack_ffffffffffffffc4;
  int iVar12;
  Parse *pOrderBy;
  WhereInfo *pWInfo_00;
  int local_4;
  
  local_40 = 0;
  sVar10 = 0;
  sVar9 = 0;
  local_88 = (ulong *)0x0;
  pWInfo_00 = (WhereInfo *)*in_RDI;
  pOrderBy = pWInfo_00->pParse;
  uVar5 = (uint)*(byte *)((long)in_RDI + 0x42);
  if (uVar5 < 2) {
    iVar8 = 1;
  }
  else {
    iVar8 = 10;
    if (uVar5 == 2) {
      iVar8 = 5;
    }
  }
  if ((in_RDI[2] == 0) || (in_SI == 0)) {
    iVar11 = 0;
  }
  else {
    iVar11 = *(int *)in_RDI[2];
  }
  local_94 = (uVar5 * 8 + 0x20) * iVar8 * 2 + iVar11 * 2;
  local_90 = (ulong *)sqlite3DbMallocRawNN
                                ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff1c,iVar8),
                                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (local_90 == (ulong *)0x0) {
    local_4 = 7;
  }
  else {
    local_58 = local_90 + (long)iVar8 * 4;
    local_60 = local_90;
    memset(local_58,0,0x20);
    local_80 = local_58 + (long)iVar8 * 4;
    local_68 = local_60;
    for (iVar6 = iVar8 << 1; 0 < iVar6; iVar6 = iVar6 + -1) {
      local_68[3] = (ulong)local_80;
      local_68 = local_68 + 4;
      local_80 = local_80 + (int)uVar5;
    }
    if (iVar11 != 0) {
      local_88 = local_80;
      memset(local_80,0,(long)iVar11 << 1);
    }
    if (*(uint *)&(pWInfo_00->sWC).aStatic[0].field_0x24 < 0x30) {
      uVar7 = *(undefined4 *)&(pWInfo_00->sWC).aStatic[0].field_0x24;
    }
    else {
      uVar7 = 0x30;
    }
    *(short *)(local_58 + 2) = (short)uVar7;
    local_50 = 1;
    if (iVar11 != 0) {
      in_stack_ffffffffffffff10 = iVar11;
      if (uVar5 != 0) {
        in_stack_ffffffffffffff10 = -1;
      }
      *(char *)((long)local_58 + 0x16) = (char)in_stack_ffffffffffffff10;
    }
    for (iVar6 = 0; iVar6 < (int)uVar5; iVar6 = iVar6 + 1) {
      local_4c = 0;
      local_68 = local_58;
      for (iVar12 = 0; iVar12 < local_50; iVar12 = iVar12 + 1) {
        for (local_78 = (ulong *)in_RDI[10]; local_78 != (ulong *)0x0;
            local_78 = (ulong *)local_78[8]) {
          local_9b = *(byte *)((long)local_68 + 0x16);
          local_b0 = 0;
          if ((((*local_78 & (*local_68 ^ 0xffffffffffffffff)) == 0) &&
              ((local_78[1] & *local_68) == 0)) &&
             (((local_78[5] & 0x4000) == 0 || (2 < (short)local_68[2])))) {
            local_9a = sqlite3LogEstAdd(*(LogEst *)((long)local_78 + 0x12),
                                        *(short *)((long)local_78 + 0x14) + (short)local_68[2]);
            local_9a = sqlite3LogEstAdd(local_9a,*(LogEst *)((long)local_68 + 0x14));
            local_96 = (short)local_68[2] + *(short *)((long)local_78 + 0x16);
            local_a8 = *local_68 | local_78[1];
            if ((char)local_9b < '\0') {
              in_stack_ffffffffffffff08 = &local_b0;
              local_9b = wherePathSatisfiesOrderBy
                                   (pWInfo_00,(ExprList *)pOrderBy,
                                    (WherePath *)CONCAT44(iVar6,iVar12),
                                    (u16)((uint)in_stack_ffffffffffffffc4 >> 0x10),
                                    (u16)in_stack_ffffffffffffffc4,
                                    (WhereLoop *)CONCAT44(iVar11,CONCAT22(sVar10,sVar9)),in_RDI);
            }
            else {
              local_b0 = local_68[1];
            }
            if (((char)local_9b < '\0') || (iVar11 <= (char)local_9b)) {
              local_98 = local_9a;
              local_9a = local_9a + -2;
            }
            else {
              if (*(short *)((long)local_88 + (long)(char)local_9b * 2) == 0) {
                LVar4 = whereSortingCost((WhereInfo *)CONCAT44(uVar7,in_stack_ffffffffffffff10),
                                         (LogEst)((ulong)in_stack_ffffffffffffff08 >> 0x30),
                                         (int)in_stack_ffffffffffffff08,0);
                *(LogEst *)((long)local_88 + (long)(char)local_9b * 2) = LVar4;
              }
              LVar4 = sqlite3LogEstAdd(local_9a,*(LogEst *)
                                                 ((long)local_88 + (long)(char)local_9b * 2));
              local_98 = LVar4 + 5;
            }
            in_stack_ffffffffffffffc4 = 0;
            local_70 = local_60;
            while ((in_stack_ffffffffffffffc4 < local_4c &&
                   ((*local_70 != local_a8 ||
                    (((int)(char)(*(byte *)((long)local_70 + 0x16) ^ local_9b) & 0x80U) != 0))))) {
              in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1;
              local_70 = local_70 + 4;
            }
            if (in_stack_ffffffffffffffc4 < local_4c) {
              if ((local_98 <= *(short *)((long)local_70 + 0x12)) &&
                 ((*(short *)((long)local_70 + 0x12) != local_98 ||
                  ((local_96 <= (short)local_70[2] &&
                   (((short)local_70[2] != local_96 ||
                    (local_9a < *(short *)((long)local_70 + 0x14))))))))) goto LAB_001bbc0f;
            }
            else if ((local_4c < iVar8) ||
                    ((local_98 <= sVar10 && ((local_98 != sVar10 || (local_9a < sVar9)))))) {
              iVar2 = local_4c;
              in_stack_ffffffffffffffc4 = local_40;
              if (local_4c < iVar8) {
                iVar2 = local_4c + 1;
                in_stack_ffffffffffffffc4 = local_4c;
              }
              local_4c = iVar2;
              local_70 = local_60 + (long)in_stack_ffffffffffffffc4 * 4;
LAB_001bbc0f:
              *local_70 = *local_68 | local_78[1];
              local_70[1] = local_b0;
              *(short *)(local_70 + 2) = local_96;
              *(short *)((long)local_70 + 0x12) = local_98;
              *(LogEst *)((long)local_70 + 0x14) = local_9a;
              *(byte *)((long)local_70 + 0x16) = local_9b;
              memcpy((void *)local_70[3],(void *)local_68[3],(long)iVar6 << 3);
              *(ulong **)(local_70[3] + (long)iVar6 * 8) = local_78;
              if (iVar8 <= local_4c) {
                local_40 = 0;
                sVar10 = *(short *)((long)local_60 + 0x12);
                sVar9 = (short)local_60[2];
                puVar1 = local_60;
                for (in_stack_ffffffffffffffc4 = 1; local_70 = puVar1 + 4,
                    in_stack_ffffffffffffffc4 < iVar8;
                    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
                  if ((sVar10 < *(short *)((long)puVar1 + 0x32)) ||
                     ((*(short *)((long)puVar1 + 0x32) == sVar10 &&
                      (sVar9 < *(short *)((long)puVar1 + 0x34))))) {
                    sVar10 = *(short *)((long)puVar1 + 0x32);
                    sVar9 = *(short *)((long)puVar1 + 0x34);
                    local_40 = in_stack_ffffffffffffffc4;
                  }
                  puVar1 = local_70;
                }
              }
            }
          }
        }
        local_68 = local_68 + 4;
      }
      local_68 = local_60;
      puVar1 = local_58;
      local_58 = local_60;
      local_50 = local_4c;
      local_60 = puVar1;
    }
    if (local_50 == 0) {
      sqlite3ErrorMsg((Parse *)pWInfo_00,"no query solution");
      sqlite3DbFreeNN((sqlite3 *)CONCAT44(uVar7,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
                     );
      local_4 = 1;
    }
    else {
      local_68 = local_58;
      for (iVar8 = 1; iVar8 < local_50; iVar8 = iVar8 + 1) {
        if (*(short *)((long)local_58 + (long)iVar8 * 0x20 + 0x12) <
            *(short *)((long)local_68 + 0x12)) {
          local_68 = local_58 + (long)iVar8 * 4;
        }
      }
      for (iVar6 = 0; iVar6 < (int)uVar5; iVar6 = iVar6 + 1) {
        local_b8 = in_RDI + (long)iVar6 * 0xb + 0x73;
        local_78 = *(ulong **)(local_68[3] + (long)iVar6 * 8);
        local_b8[9] = (Bitmask)local_78;
        *(char *)((long)local_b8 + 0x2c) = (char)local_78[2];
        *(undefined4 *)((long)local_b8 + 4) =
             *(undefined4 *)(in_RDI[1] + (ulong)*(byte *)((long)local_b8 + 0x2c) * 0x70 + 0x48);
      }
      if (((((in_RDI[8] & 0x100) != 0) && ((in_RDI[8] & 0x80) == 0)) &&
          (*(char *)((long)in_RDI + 0x47) == '\0')) && (in_SI != 0)) {
        in_stack_ffffffffffffff08 = &local_c0;
        iVar3 = wherePathSatisfiesOrderBy
                          (pWInfo_00,(ExprList *)pOrderBy,(WherePath *)CONCAT44(iVar6,iVar8),
                           (u16)((uint)in_stack_ffffffffffffffc4 >> 0x10),
                           (u16)in_stack_ffffffffffffffc4,
                           (WhereLoop *)CONCAT44(iVar11,CONCAT22(sVar10,sVar9)),in_RDI);
        local_c4 = (int)iVar3;
        if (local_c4 == *(int *)in_RDI[3]) {
          *(undefined1 *)((long)in_RDI + 0x47) = 2;
        }
      }
      *(undefined1 *)(in_RDI + 9) = 0;
      if (in_RDI[2] != 0) {
        if ((in_RDI[8] & 0x80) == 0) {
          *(undefined1 *)((long)in_RDI + 0x43) = *(undefined1 *)((long)local_68 + 0x16);
          in_RDI[0xb] = local_68[1];
          if (((*(char *)((long)in_RDI + 0x43) < '\x01') &&
              (*(undefined1 *)((long)in_RDI + 0x43) = 0, uVar5 != 0)) &&
             ((local_c8 = *(uint *)(*(long *)(local_68[3] + (long)(int)(uVar5 - 1) * 8) + 0x28),
              (local_c8 & 0x1000) == 0 && ((local_c8 & 0x104) != 0x104)))) {
            local_d0 = 0;
            in_stack_ffffffffffffff08 = &local_d0;
            iVar3 = wherePathSatisfiesOrderBy
                              (pWInfo_00,(ExprList *)pOrderBy,(WherePath *)CONCAT44(iVar6,iVar8),
                               (u16)((uint)in_stack_ffffffffffffffc4 >> 0x10),
                               (u16)in_stack_ffffffffffffffc4,
                               (WhereLoop *)CONCAT44(iVar11,CONCAT22(sVar10,sVar9)),in_RDI);
            local_d4 = (int)iVar3;
            if (local_d4 == *(int *)in_RDI[2]) {
              *(undefined1 *)(in_RDI + 9) = 1;
              in_RDI[0xb] = local_d0;
            }
          }
        }
        else if ((int)*(char *)((long)local_68 + 0x16) == *(int *)in_RDI[2]) {
          *(undefined1 *)((long)in_RDI + 0x47) = 2;
        }
        if ((((in_RDI[8] & 0x200) != 0) &&
            ((int)*(char *)((long)in_RDI + 0x43) == *(int *)in_RDI[2])) && (uVar5 != 0)) {
          local_e0 = 0;
          in_stack_ffffffffffffff08 = &local_e0;
          iVar3 = wherePathSatisfiesOrderBy
                            (pWInfo_00,(ExprList *)pOrderBy,(WherePath *)CONCAT44(iVar6,iVar8),
                             (u16)((uint)in_stack_ffffffffffffffc4 >> 0x10),
                             (u16)in_stack_ffffffffffffffc4,
                             (WhereLoop *)CONCAT44(iVar11,CONCAT22(sVar10,sVar9)),in_RDI);
          if ((int)iVar3 == *(int *)in_RDI[2]) {
            *(undefined1 *)((long)in_RDI + 0x44) = 1;
            in_RDI[0xb] = local_e0;
          }
        }
      }
      *(short *)(in_RDI + 0xc) = (short)local_68[2];
      sqlite3DbFreeNN((sqlite3 *)CONCAT44(uVar7,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
                     );
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  sqlite3 *db;              /* The database connection */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsorted = 0;    /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  db = pParse->db;
  nLoop = pWInfo->nLevel;
  /* TUNING: For simple queries, only the best path is tracked.
  ** For 2-way joins, the 5 best paths are followed.
  ** For joins of 3 or more tables, track the 10 best paths */
  mxChoice = (nLoop<=1) ? 1 : (nLoop==2 ? 5 : 10);
  assert( nLoop<=pWInfo->pTabList->nSrc );
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d)\n", nRowEst));

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3DbMallocRawNN(db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array 
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered, 
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsorted;                 /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered = pFrom->isOrdered;  /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask = 0;              /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop. 
        ** Compute its cost */
        rUnsorted = sqlite3LogEstAdd(pWLoop->rSetup,pWLoop->rRun + pFrom->nRow);
        rUnsorted = sqlite3LogEstAdd(rUnsorted, pFrom->rUnsorted);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        if( isOrdered<0 ){
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (5) to sorting as an
          ** extra encouragment to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsorted, aSortCost[isOrdered]) + 5;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy, 
               rUnsorted, rCost));
        }else{
          rCost = rUnsorted;
          rUnsorted -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsorted>=mxUnsorted))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          ** 
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsorted) <= (rCost,nOut,rUnsorted)
          */
          if( pTo->rCost<rCost 
           || (pTo->rCost==rCost
               && (pTo->nRow<nOut
                   || (pTo->nRow==nOut && pTo->rUnsorted<=rUnsorted)
                  )
              )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsorted = rUnsorted;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsorted = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost 
             || (pTo->rCost==mxCost && pTo->rUnsorted>mxUnsorted) 
            ){
              mxCost = pTo->rCost;
              mxUnsorted = pTo->rUnsorted;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
        sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
           wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
           pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
        if( pTo->isOrdered>0 ){
          sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
        }else{
          sqlite3DebugPrintf("\n");
        }
      }
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3DbFreeNN(db, pSpace);
    return SQLITE_ERROR;
  }
  
  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
    }else{
      pWInfo->nOBSat = pFrom->isOrdered;
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0 
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, 
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }


  pWInfo->nRowOut = pFrom->nRow;

  /* Free temporary memory and return success */
  sqlite3DbFreeNN(db, pSpace);
  return SQLITE_OK;
}